

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

void xmlDictFree(xmlDictPtr dict)

{
  int iVar1;
  xmlDictStringsPtr pxVar2;
  xmlDictStringsPtr_conflict pxVar3;
  
  if (dict != (xmlDictPtr)0x0) {
    xmlMutexLock(&xmlDictMutex);
    iVar1 = dict->ref_counter;
    dict->ref_counter = iVar1 + -1;
    xmlMutexUnlock(&xmlDictMutex);
    if (iVar1 < 2) {
      if (dict->subdict != (xmlDictPtr)0x0) {
        xmlDictFree(dict->subdict);
      }
      if (dict->table != (xmlDictEntry *)0x0) {
        (*xmlFree)(dict->table);
      }
      pxVar3 = dict->strings;
      while (pxVar3 != (xmlDictStringsPtr_conflict)0x0) {
        pxVar2 = pxVar3->next;
        (*xmlFree)(pxVar3);
        pxVar3 = pxVar2;
      }
      (*xmlFree)(dict);
      return;
    }
  }
  return;
}

Assistant:

void
xmlDictFree(xmlDictPtr dict) {
    xmlDictStringsPtr pool, nextp;

    if (dict == NULL)
	return;

    /* decrement the counter, it may be shared by a parser and docs */
    xmlMutexLock(&xmlDictMutex);
    dict->ref_counter--;
    if (dict->ref_counter > 0) {
        xmlMutexUnlock(&xmlDictMutex);
        return;
    }

    xmlMutexUnlock(&xmlDictMutex);

    if (dict->subdict != NULL) {
        xmlDictFree(dict->subdict);
    }

    if (dict->table) {
	xmlFree(dict->table);
    }
    pool = dict->strings;
    while (pool != NULL) {
        nextp = pool->next;
	xmlFree(pool);
	pool = nextp;
    }
    xmlFree(dict);
}